

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void SetRow_ERMS(uint8_t *dst,uint8_t v8,int width)

{
  long lVar1;
  
  for (lVar1 = (long)width; lVar1 != 0; lVar1 = lVar1 + -1) {
    *dst = v8;
    dst = dst + 1;
  }
  return;
}

Assistant:

void SetRow_ERMS(uint8_t* dst, uint8_t v8, int width) {
  size_t width_tmp = (size_t)(width);
  asm volatile(

      "rep         stosb                         \n"
      : "+D"(dst),       // %0
        "+c"(width_tmp)  // %1
      : "a"(v8)          // %2
      : "memory", "cc");
}